

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_State_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Entity_State_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Entity_State_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  reference this_00;
  VariableParameter *pVVar3;
  KINT32 Value;
  string local_380 [32];
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>_>
  local_360;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_330;
  KString local_310;
  KString local_2f0;
  KString local_2d0;
  KString local_2b0;
  KString local_290;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Entity_State_PDU *local_18;
  Entity_State_PDU *this_local;
  
  local_18 = this;
  this_local = (Entity_State_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,&this->super_Header);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-Entity State PDU-\n");
  poVar2 = std::operator<<(poVar2,"Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_210,&this->m_EntityID);
  UTILS::IndentString(&local_1f0,&local_210,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"Force ID:                       ");
  DATA_TYPE::ENUMS::GetEnumAsStringForceID_abi_cxx11_
            (&local_230,(ENUMS *)(ulong)this->m_ui8ForceID,Value);
  poVar2 = std::operator<<(poVar2,(string *)&local_230);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Of Variable Params:  ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8NumOfVariableParams);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Entity Type:                    ");
  DATA_TYPE::EntityType::GetAsString_abi_cxx11_(&local_250,&this->m_EntityType);
  poVar2 = std::operator<<(poVar2,(string *)&local_250);
  poVar2 = std::operator<<(poVar2,"Alternative Entity Type:        ");
  DATA_TYPE::EntityType::GetAsString_abi_cxx11_(&local_270,&this->m_AltEntityType);
  poVar2 = std::operator<<(poVar2,(string *)&local_270);
  poVar2 = std::operator<<(poVar2,"Linear Velocity:                ");
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_290,&this->m_EntityLinearVelocity);
  poVar2 = std::operator<<(poVar2,(string *)&local_290);
  poVar2 = std::operator<<(poVar2,"Entity Location:                ");
  DATA_TYPE::WorldCoordinates::GetAsString_abi_cxx11_(&local_2b0,&this->m_EntityLocation);
  poVar2 = std::operator<<(poVar2,(string *)&local_2b0);
  poVar2 = std::operator<<(poVar2,"Entity Orientation:             ");
  DATA_TYPE::EulerAngles::GetAsString_abi_cxx11_(&local_2d0,&this->m_EntityOrientation);
  poVar2 = std::operator<<(poVar2,(string *)&local_2d0);
  DATA_TYPE::EntityAppearance::GetAsString_abi_cxx11_
            (&local_2f0,&this->m_EntityAppearance,&this->m_EntityType);
  poVar2 = std::operator<<(poVar2,(string *)&local_2f0);
  DATA_TYPE::DeadReckoningParameter::GetAsString_abi_cxx11_
            (&local_310,&this->m_DeadReckoningParameter);
  poVar2 = std::operator<<(poVar2,(string *)&local_310);
  DATA_TYPE::EntityMarking::GetAsString_abi_cxx11_(&local_330,&this->m_EntityMarking);
  poVar2 = std::operator<<(poVar2,(string *)&local_330);
  DATA_TYPE::EntityCapabilities::GetAsString_abi_cxx11_
            ((KString *)&citr,&this->m_EntityCapabilities);
  std::operator<<(poVar2,(string *)&citr);
  std::__cxx11::string::~string((string *)&citr);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  citrEnd = std::
            vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
            ::begin(&this->m_vVariableParameters);
  local_360._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
       ::end(&this->m_vVariableParameters);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_360);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>_>
              ::operator*(&citrEnd);
    pVVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::operator->(this_00);
    (*(pVVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(local_380);
    std::operator<<(local_190,local_380);
    std::__cxx11::string::~string(local_380);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>_>
    ::operator++(&citrEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Entity_State_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Entity State PDU-\n"
       << "Entity ID:\n"
       << IndentString( m_EntityID.GetAsString(), 1 )
       << "Force ID:                       " << GetEnumAsStringForceID( m_ui8ForceID )  << "\n"
       << "Number Of Variable Params:  " << ( KUINT16 )m_ui8NumOfVariableParams << "\n"
       << "Entity Type:                    " << m_EntityType.GetAsString()
       << "Alternative Entity Type:        " << m_AltEntityType.GetAsString()
       << "Linear Velocity:                " << m_EntityLinearVelocity.GetAsString()
       << "Entity Location:                " << m_EntityLocation.GetAsString()
       << "Entity Orientation:             " << m_EntityOrientation.GetAsString()
       << m_EntityAppearance.GetAsString( m_EntityType )
       << m_DeadReckoningParameter.GetAsString()
       << m_EntityMarking.GetAsString()
       << m_EntityCapabilities.GetAsString();

    // Add the articulated parts
    vector<VarPrmPtr>::const_iterator citr = m_vVariableParameters.begin();
    vector<VarPrmPtr>::const_iterator citrEnd = m_vVariableParameters.end();
    for( ; citr != citrEnd; ++ citr )
    {
        ss << ( *citr )->GetAsString();
    }

    return ss.str();
}